

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-chest.c
# Opt level: O2

parser_error parse_chest_trap_magic(parser *p)

{
  wchar_t wVar1;
  parser_error pVar2;
  void *pvVar3;
  
  pvVar3 = parser_priv(p);
  if (pvVar3 == (void *)0x0) {
    pVar2 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    wVar1 = parser_getint(p,"val");
    pVar2 = PARSE_ERROR_NONE;
    if (wVar1 != L'\0') {
      *(undefined1 *)((long)pvVar3 + 0x2d) = 1;
    }
  }
  return pVar2;
}

Assistant:

static enum parser_error parse_chest_trap_magic(struct parser *p) {
    struct chest_trap *t = parser_priv(p);
	int val = 0;

	if (!t)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
    val = parser_getint(p, "val");
	if (val) {
		t->magic = true;
	}
    return PARSE_ERROR_NONE;
}